

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O3

void sprintf<unsigned_long>(stringstream *oss,string *fmt,unsigned_long value)

{
  ostream *poVar1;
  ostream *poVar2;
  char cVar3;
  int iVar4;
  pointer pcVar5;
  long lVar6;
  char *__nptr;
  char *__nptr_00;
  bool bVar7;
  char *pcVar8;
  byte bVar9;
  runtime_error *prVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [12];
  char local_60;
  undefined7 uStack_5f;
  long local_50 [2];
  char *local_40;
  unsigned_long local_38;
  
  if (fmt->_M_string_length != 0) {
    poVar1 = (ostream *)(oss + 0x10);
    uVar15 = 0;
    do {
      pcVar5 = (fmt->_M_dataplus)._M_p;
      cVar3 = pcVar5[uVar15];
      uVar13 = uVar15;
      if ((cVar3 == '%') && (uVar13 = uVar15 + 1, pcVar5[uVar15 + 1] != '%')) {
        local_38 = value;
        uVar15 = std::__cxx11::string::find_first_of((char *)fmt,0x12ed72,uVar13);
        if (uVar15 <= uVar13) {
          bVar7 = false;
          uVar14 = uVar13;
          goto LAB_00117450;
        }
        bVar7 = false;
        goto LAB_0011737e;
      }
      local_60 = cVar3;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_60,1);
      uVar15 = uVar13 + 1;
    } while (uVar15 < fmt->_M_string_length);
  }
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar10,"extra arguments provided to sprintf");
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
LAB_0011737e:
  do {
    bVar9 = (fmt->_M_dataplus)._M_p[uVar13];
    uVar14 = uVar13;
    if (bVar9 < 0x2b) {
      if (bVar9 != 0x20) {
        if (bVar9 != 0x23) break;
        bVar7 = true;
      }
    }
    else if (bVar9 == 0x2b) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) | 0x800;
    }
    else if (bVar9 == 0x2d) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) & 0xffffff4f | 0x20;
    }
    else {
      if (bVar9 != 0x30) break;
      if (((byte)oss[*(long *)(*(long *)oss + -0x18) + 0x18] & 0x20) == 0) {
        poVar2 = poVar1 + *(long *)(*(long *)poVar1 + -0x18);
        if (oss[*(long *)(*(long *)poVar1 + -0x18) + 0xf1] == (stringstream)0x0) {
          std::ios::widen((char)poVar2);
          poVar2[0xe1] = (ostream)0x1;
        }
        poVar2[0xe0] = (ostream)0x30;
      }
    }
    uVar13 = uVar13 + 1;
    uVar14 = uVar15;
  } while (uVar15 != uVar13);
LAB_00117450:
  std::__cxx11::string::substr((ulong)&local_60,(ulong)fmt);
  __nptr = (char *)CONCAT71(uStack_5f,local_60);
  piVar11 = __errno_location();
  iVar4 = *piVar11;
  *piVar11 = 0;
  lVar12 = strtol(__nptr,&local_40,10);
  pcVar8 = local_40;
  if (local_40 == __nptr) {
    std::__throw_invalid_argument("stoi");
LAB_00117695:
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_00117695;
    if (*piVar11 == 0) {
      *piVar11 = iVar4;
    }
    if ((long *)CONCAT71(uStack_5f,local_60) != local_50) {
      operator_delete((long *)CONCAT71(uStack_5f,local_60),local_50[0] + 1);
    }
    *(long *)(oss + *(long *)(*(long *)poVar1 + -0x18) + 0x20) = lVar12;
    bVar9 = pcVar8[(long)((fmt->_M_dataplus)._M_p + (uVar14 - (long)__nptr))];
    if (bVar9 != 0x2e) {
LAB_001175e7:
      if ((bVar9 | 0x20) == 0x78) {
        lVar12 = *(long *)poVar1;
        lVar6 = *(long *)(lVar12 + -0x18);
        *(uint *)(oss + lVar6 + 0x28) = *(uint *)(oss + lVar6 + 0x28) & 0xffffffb5 | 8;
        if (bVar7) {
          *(uint *)(oss + *(long *)(lVar12 + -0x18) + 0x28) =
               *(uint *)(oss + *(long *)(lVar12 + -0x18) + 0x28) | 0x200;
        }
      }
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__cxx11::string::substr((ulong)&local_60,(ulong)fmt);
      sprintf((char *)oss,&local_60);
      if ((long *)CONCAT71(uStack_5f,local_60) != local_50) {
        operator_delete((long *)CONCAT71(uStack_5f,local_60),local_50[0] + 1);
      }
      return;
    }
    std::__cxx11::string::substr((ulong)&local_60,(ulong)fmt);
    __nptr_00 = (char *)CONCAT71(uStack_5f,local_60);
    piVar11 = __errno_location();
    iVar4 = *piVar11;
    *piVar11 = 0;
    lVar12 = strtol(__nptr_00,&local_40,10);
    if (local_40 != __nptr_00) {
      if ((0xfffffffeffffffff < lVar12 - 0x80000000U) && (*piVar11 != 0x22)) {
        if (*piVar11 == 0) {
          *piVar11 = iVar4;
        }
        if ((long *)CONCAT71(uStack_5f,local_60) != local_50) {
          operator_delete((long *)CONCAT71(uStack_5f,local_60),local_50[0] + 1);
        }
        *(long *)(oss + *(long *)(*(long *)poVar1 + -0x18) + 0x18) = lVar12;
        bVar9 = local_40[(long)(pcVar8 + (long)((fmt->_M_dataplus)._M_p +
                                               (((uVar14 - (long)__nptr) + 1) - (long)__nptr_00)))];
        goto LAB_001175e7;
      }
      goto LAB_001176ad;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_001176ad:
  auVar16 = std::__throw_out_of_range("stoi");
  if (auVar16._8_4_ != 1) {
    _Unwind_Resume(auVar16._0_8_);
  }
  __cxa_begin_catch(auVar16._0_8_);
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar10,"Expected precision value in sprintf");
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}